

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wenc16(uint16_t a,uint16_t b,uint16_t *l,uint16_t *h)

{
  uint uVar1;
  int iVar2;
  int d;
  int m;
  int ao;
  uint16_t *h_local;
  uint16_t *l_local;
  uint16_t b_local;
  uint16_t a_local;
  
  uVar1 = a + 0x8000 & 0xffff;
  m._0_2_ = (uint16_t)((int)(uVar1 + b) >> 1);
  iVar2 = uVar1 - b;
  if (iVar2 < 0) {
    m._0_2_ = (uint16_t)m + 0x8000;
  }
  *l = (uint16_t)m;
  *h = (uint16_t)iVar2;
  return;
}

Assistant:

static inline void
wenc16 (uint16_t a, uint16_t b, uint16_t* l, uint16_t* h)
{
    int ao = (((int) a) + A_OFFSET) & MOD_MASK;
    int m  = ((ao + ((int) b)) >> 1);
    int d  = ao - ((int) b);

    if (d < 0) m = (m + M_OFFSET) & MOD_MASK;

    d &= MOD_MASK;

    *l = (uint16_t) m;
    *h = (uint16_t) d;
}